

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLexer.cpp
# Opt level: O0

void __thiscall Jinx::Impl::Lexer::ParseString(Lexer *this)

{
  bool bVar1;
  string_view local_38;
  size_type local_28;
  size_t count;
  char *pcStack_18;
  bool validString;
  char *startName;
  Lexer *this_local;
  
  startName = (char *)this;
  AdvanceCurrent(this);
  pcStack_18 = this->m_current;
  count._7_1_ = 0;
  while( true ) {
    bVar1 = IsEndOfText(this);
    if ((((bVar1 ^ 0xffU) & 1) == 0) || (bVar1 = IsNewline(this,*this->m_current), bVar1))
    goto LAB_00158df3;
    if (*this->m_current == '\"') break;
    AdvanceCurrent(this);
  }
  count._7_1_ = 1;
LAB_00158df3:
  if ((count._7_1_ & 1) == 0) {
    Error<>(this,"Could not find matching quote");
  }
  else {
    local_28 = (long)this->m_current - (long)pcStack_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_38,pcStack_18,local_28);
    CreateSymbolString(this,local_38);
  }
  return;
}

Assistant:

inline_t void Lexer::ParseString()
	{
		// Advance past double quote character
		AdvanceCurrent();

		// Mark the start of the string
		const char * startName = m_current;

		// Check for matching end string token
		bool validString = false;
		while (!IsEndOfText())
		{
			if (IsNewline(*m_current))
				break;
			if (*m_current == '"')
			{
				validString = true;
				break;
			}
			AdvanceCurrent();
		}
		if (!validString)
		{
			Error("Could not find matching quote");
			return;
		}
		size_t count = m_current - startName;
		CreateSymbolString(std::string_view(startName, count));
	}